

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O3

string * to_hexstring_abi_cxx11_(string *__return_storage_ptr__,BN *bn)

{
  long lVar1;
  pointer puVar2;
  string group;
  stringstream stream;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream local_1b8 [16];
  long local_1a8 [2];
  undefined8 uStack_198;
  uint auStack_190 [22];
  ios_base local_138 [112];
  char acStack_c8 [152];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&local_210,&bn->ba);
  if (local_210.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_210.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start) {
    puVar2 = local_210.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish;
    do {
      std::__cxx11::stringstream::stringstream(local_1b8);
      *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
           *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
      lVar1 = *(long *)(local_1a8[0] + -0x18);
      if (acStack_c8[lVar1 + 1] == '\0') {
        std::ios::widen((char)local_1a8 + (char)lVar1);
        acStack_c8[lVar1 + 1] = '\x01';
      }
      acStack_c8[lVar1] = '0';
      *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 4;
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__cxx11::stringbuf::str();
      std::operator+(&local_1d8,__return_storage_ptr__,&local_1f8);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_1d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p);
      }
      puVar2 = puVar2 + -1;
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(local_138);
    } while (puVar2 != local_210.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                       ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_210.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_210.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

string to_hexstring(const BN& bn) {
    // TODO: make tests
    string result;

    const auto& raw = bn.raw();
    for (auto i = raw.rbegin(); i != raw.rend(); ++i) {
        stringstream stream;
        stream << hex << setfill('0') << setw(bz * 2) << static_cast<uint32_t>(*i);
        string group = stream.str();
        result = result + group;
    }
    return result;
}